

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O3

double __thiscall
Trainer::Trainer<Kuhn::Game>::chanceSamplingCFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,double pi,double po)

{
  uint8_t *__param;
  long lVar1;
  bool bVar2;
  uint actionNum;
  int iVar3;
  result_type action;
  mapped_type *ppNVar4;
  mapped_type this_00;
  double *pdVar5;
  ulong uVar6;
  iterator iVar7;
  undefined8 uVar8;
  void *pvVar9;
  ulong uVar10;
  double dVar11;
  double dVar12;
  code *pcStack_140;
  double dStack_138;
  undefined1 local_130 [8];
  Game game_cp;
  discrete_distribution<int> dist;
  string infoSet;
  double local_38;
  
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  pcStack_140 = (code *)0x113374;
  bVar2 = Kuhn::Game::done(game);
  if (bVar2) {
    dVar11 = Kuhn::Game::payoff(game,playerIndex);
    return dVar11;
  }
  pcStack_140 = (code *)0x1133a0;
  Kuhn::Game::infoSetStr_abi_cxx11_
            ((string *)
             &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,game);
  pcStack_140 = (code *)0x1133a8;
  actionNum = Kuhn::Game::actionNum(game);
  pcStack_140 = (code *)0x1133b3;
  iVar3 = Kuhn::Game::currentPlayer(game);
  pvVar9 = (void *)(long)iVar3;
  if (this->mUpdate[(long)pvVar9] == false) {
    pcStack_140 = (code *)0x11354f;
    Kuhn::Game::Game((Game *)local_130,game);
    pcStack_140 = (code *)0x113566;
    iVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this->mFixedStrategies[(long)pvVar9]._M_h,
                   (key_type *)
                   &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
        ._M_cur == (__node_type *)0x0) {
      pcStack_140 = (code *)0x11366f;
      uVar8 = std::__throw_out_of_range("_Map_base::at");
      pcStack_140 = (code *)0x11367f;
      operator_delete(pvVar9,0x30);
      if (dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != (pointer)&infoSet._M_string_length) {
        pcStack_140 = (code *)0x1136c6;
        operator_delete(dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,
                        infoSet._M_string_length + 1);
      }
      pcStack_140 = externalSamplingCFR;
      _Unwind_Resume(uVar8);
    }
    pcStack_140 = (code *)0x113578;
    pdVar5 = Node::averageStrategy
                       (*(Node **)((long)iVar7.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_true>
                                         ._M_cur + 0x28));
    pcStack_140 = (code *)0x11358e;
    std::discrete_distribution<int>::param_type::param_type<double_const*>
              ((param_type *)(game_cp.mInfoSets[1] + 9),pdVar5,pdVar5 + (int)actionNum);
    __param = game_cp.mInfoSets[1] + 9;
    pcStack_140 = (code *)0x1135a0;
    action = std::discrete_distribution<int>::operator()
                       ((discrete_distribution<int> *)__param,&this->mEngine,(param_type *)__param);
    pcStack_140 = (code *)0x1135ae;
    Kuhn::Game::step((Game *)local_130,action);
    pcStack_140 = (code *)0x1135ca;
    local_38 = chanceSamplingCFR(this,(Game *)local_130,playerIndex,pi,po);
    if (dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      pcStack_140 = (code *)0x1135ea;
      operator_delete(dist._M_param._M_prob.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      (long)dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)dist._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
    }
    if (game_cp._88_8_ != 0) {
      pcStack_140 = (code *)0x113605;
      operator_delete((void *)game_cp._88_8_,
                      (long)dist._M_param._M_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - game_cp._88_8_);
    }
  }
  else {
    pcStack_140 = (code *)0x1133e5;
    infoSet.field_2._8_8_ = game;
    ppNVar4 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->mNodeMap,
                           (key_type *)
                           &dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
    this_00 = *ppNVar4;
    if (this_00 == (mapped_type)0x0) {
      pcStack_140 = (code *)0x1133f7;
      this_00 = (mapped_type)operator_new(0x30);
      pcStack_140 = (code *)0x113405;
      Node::Node(this_00,actionNum);
      pcStack_140 = (code *)0x113414;
      ppNVar4 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->mNodeMap,
                             (key_type *)
                             &dist._M_param._M_cp.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
      *ppNVar4 = this_00;
    }
    pcStack_140 = (code *)0x11341f;
    pdVar5 = Node::strategy(this_00);
    uVar6 = (ulong)actionNum;
    lVar1 = -(uVar6 * 8 + 0xf & 0xfffffffffffffff0);
    if ((int)actionNum < 1) {
      local_38 = 0.0;
      if (iVar3 != playerIndex) goto LAB_00113630;
    }
    else {
      local_38 = 0.0;
      uVar10 = 0;
      do {
        uVar8 = infoSet.field_2._8_8_;
        *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x113479;
        Kuhn::Game::Game((Game *)local_130,(Game *)uVar8);
        *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x113484;
        Kuhn::Game::step((Game *)local_130,(int)uVar10);
        if (iVar3 == playerIndex) {
          dVar11 = pdVar5[uVar10] * pi;
          dVar12 = po;
        }
        else {
          dVar11 = pi;
          dVar12 = pdVar5[uVar10] * po;
        }
        *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x1134b8;
        dVar11 = chanceSamplingCFR(this,(Game *)local_130,playerIndex,dVar11,dVar12);
        *(double *)((long)&dStack_138 + uVar10 * 8 + lVar1 + -0x138 + 0x138) = dVar11;
        local_38 = local_38 + dVar11 * pdVar5[uVar10];
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
      if (iVar3 != playerIndex) goto LAB_00113630;
      if (0 < (int)actionNum) {
        uVar10 = 0;
        do {
          dVar11 = *(double *)((long)&dStack_138 + uVar10 * 8 + lVar1 + -0x138 + 0x138);
          *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x113511;
          dVar12 = Node::regretSum(this_00,(int)uVar10);
          *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x113532;
          Node::regretSum(this_00,(int)uVar10,(dVar11 - local_38) * po + dVar12);
          uVar10 = uVar10 + 1;
        } while (uVar6 != uVar10);
      }
    }
    *(undefined8 *)((long)&pcStack_140 + lVar1) = 0x11362c;
    Node::strategySum(this_00,pdVar5,pi);
  }
LAB_00113630:
  if (dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)&infoSet._M_string_length) {
    pcStack_140 = (code *)0x11364f;
    operator_delete(dist._M_param._M_cp.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,infoSet._M_string_length + 1);
  }
  return local_38;
}

Assistant:

double Trainer<T>::chanceSamplingCFR(const T &game, const int playerIndex, const double pi, const double po) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // treat static player as chance node
    const int actionNum = game.actionNum();
    const int player = game.currentPlayer();
    if (!mUpdate[player]) {
        auto game_cp(game);
        auto strategy = mFixedStrategies[player].at(infoSet)->averageStrategy();
        std::discrete_distribution<int> dist(strategy, strategy + actionNum);
        game_cp.step(dist(mEngine));
        return chanceSamplingCFR(game_cp, playerIndex, pi, po);
    }

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    const double *strategy = node->strategy();

    // for each action, recursively call cfr with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        if (player == playerIndex) {
            utils[a] = chanceSamplingCFR(game_cp, playerIndex, pi * strategy[a], po);
        } else {
            utils[a] = chanceSamplingCFR(game_cp, playerIndex, pi, po * strategy[a]);
        }
        nodeUtil += strategy[a] * utils[a];
    }

    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        for (int a = 0; a < actionNum; ++a) {
            const double regret = utils[a] - nodeUtil;
            const double regretSum = node->regretSum(a) + po * regret;
            node->regretSum(a, regretSum);
        }
        // update average strategy across all training iterations
        node->strategySum(strategy, pi);
    }

    return nodeUtil;
}